

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O0

void WebPReplaceTransparentPixels(WebPPicture *pic,uint32_t color)

{
  uint in_ESI;
  int *in_RDI;
  uint32_t *argb;
  int y;
  uint32_t *local_18;
  int local_10;
  
  if ((in_RDI != (int *)0x0) && (*in_RDI != 0)) {
    local_10 = in_RDI[3];
    local_18 = *(uint32_t **)(in_RDI + 0x12);
    WebPInitAlphaProcessing();
    while (0 < local_10) {
      (*WebPAlphaReplace)(local_18,in_RDI[2],in_ESI & 0xffffff);
      local_18 = local_18 + in_RDI[0x14];
      local_10 = local_10 + -1;
    }
  }
  return;
}

Assistant:

void WebPReplaceTransparentPixels(WebPPicture* const pic, uint32_t color) {
  if (pic != NULL && pic->use_argb) {
    int y = pic->height;
    uint32_t* argb = pic->argb;
    color &= 0xffffffu;   // force alpha=0
    WebPInitAlphaProcessing();
    while (y-- > 0) {
      WebPAlphaReplace(argb, pic->width, color);
      argb += pic->argb_stride;
    }
  }
}